

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O2

ClassBuilder * __thiscall Lodtalk::ClassBuilder::setName(ClassBuilder *this,char *name)

{
  VMContext *pVVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar2;
  Class *pCVar3;
  allocator local_39;
  string local_38;
  
  pVVar1 = this->context;
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)ByteSymbol::fromNative(pVVar1,&local_38);
  pCVar3 = Ref<Lodtalk::Class>::operator->(&this->clazz);
  (pCVar3->name).field_0 = aVar2;
  std::__cxx11::string::~string((string *)&local_38);
  pVVar1 = this->context;
  pCVar3 = Ref<Lodtalk::Class>::operator->(&this->clazz);
  VMContext::setGlobalVariable
            (pVVar1,(Oop)(pCVar3->name).field_0,(Oop)(this->clazz).reference.oop.field_0);
  return this;
}

Assistant:

ClassBuilder &ClassBuilder::setName(const char *name)
{
    clazz->name = ByteSymbol::fromNative(context, name);
    context->setGlobalVariable(clazz->name, clazz.getOop());
    return *this;
}